

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_>::expand
          (Stack<std::tuple<unsigned_int,_Kernel::IntegerConstantType>_> *this)

{
  tuple<unsigned_int,_Kernel::IntegerConstantType> *ptVar1;
  _Tuple_impl<1UL,_Kernel::IntegerConstantType> *p_Var2;
  tuple<unsigned_int,_Kernel::IntegerConstantType> *ptVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  
  sVar7 = 8;
  if (this->_capacity != 0) {
    sVar7 = this->_capacity * 2;
  }
  uVar4 = sVar7 * 0x18;
  if (uVar4 == 0) {
    ptVar3 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x11) {
    ptVar3 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar4 < 0x19) {
    ptVar3 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar4 < 0x21) {
    ptVar3 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    ptVar3 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    ptVar3 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    ptVar3 = (tuple<unsigned_int,_Kernel::IntegerConstantType> *)::operator_new(uVar4,0x10);
  }
  if (this->_capacity == 0) {
    uVar4 = 0;
  }
  else {
    lVar5 = 0;
    uVar6 = 0;
    do {
      ptVar1 = this->_stack;
      Kernel::IntegerConstantType::IntegerConstantType
                ((IntegerConstantType *)
                 ((long)&(ptVar3->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>)
                         .super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                         super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val
                         [0]._mp_alloc + lVar5),
                 (IntegerConstantType *)
                 ((long)&(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>)
                         .super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                         super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val
                         [0]._mp_alloc + lVar5));
      *(undefined4 *)
       ((long)&((_Head_base<0UL,_unsigned_int,_false> *)
               (&(ptVar3->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                 super__Tuple_impl<1UL,_Kernel::IntegerConstantType> + 1))->_M_head_impl + lVar5) =
           *(undefined4 *)
            ((long)&((_Head_base<0UL,_unsigned_int,_false> *)
                    (&(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                      super__Tuple_impl<1UL,_Kernel::IntegerConstantType> + 1))->_M_head_impl +
            lVar5);
      mpz_clear((__mpz_struct *)
                ((long)&(this->_stack->
                        super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                        super__Tuple_impl<1UL,_Kernel::IntegerConstantType>.
                        super__Head_base<1UL,_Kernel::IntegerConstantType,_false>._M_head_impl._val
                        [0]._mp_alloc + lVar5));
      uVar6 = uVar6 + 1;
      uVar4 = this->_capacity;
      lVar5 = lVar5 + 0x18;
    } while (uVar6 < uVar4);
    ptVar1 = this->_stack;
    if (ptVar1 != (tuple<unsigned_int,_Kernel::IntegerConstantType> *)0x0) {
      uVar6 = uVar4 * 0x18 + 0xf & 0xfffffffffffffff0;
      if (uVar6 == 0) {
        p_Var2 = &(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._20_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ptVar1;
      }
      else if (uVar6 < 0x11) {
        p_Var2 = &(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._44_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ptVar1;
      }
      else if (uVar6 < 0x19) {
        p_Var2 = &(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._68_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ptVar1;
      }
      else if (uVar6 < 0x21) {
        p_Var2 = &(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._92_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ptVar1;
      }
      else if (uVar6 < 0x31) {
        p_Var2 = &(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ptVar1;
      }
      else if (uVar6 < 0x41) {
        p_Var2 = &(ptVar1->super__Tuple_impl<0UL,_unsigned_int,_Kernel::IntegerConstantType>).
                  super__Tuple_impl<1UL,_Kernel::IntegerConstantType>;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_alloc = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_4_;
        (p_Var2->super__Head_base<1UL,_Kernel::IntegerConstantType,_false>)._M_head_impl._val[0].
        _mp_size = GLOBAL_SMALL_OBJECT_ALLOCATOR._140_4_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ptVar1;
      }
      else {
        operator_delete(ptVar1,0x10);
        uVar4 = this->_capacity;
      }
    }
  }
  this->_stack = ptVar3;
  this->_cursor = ptVar3 + uVar4;
  this->_end = ptVar3 + sVar7;
  this->_capacity = sVar7;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }